

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void libcellml::updateComponentsVariablesUnitsNames
               (string *name,ComponentPtr *component,UnitsPtr *units)

{
  undefined8 name_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **name_01;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ComponentPtr childComponent;
  ModelPtr importModel;
  VariablePtr variable;
  ComponentPtr importComponent;
  string local_98;
  undefined1 local_78 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  ComponentEntity local_40;
  
  sVar4 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (sVar4 != 0) {
    uVar5 = 0;
    do {
      Component::variable((Component *)(local_78 + 0x10),
                          (size_t)(component->
                                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
      bVar2 = ImportedEntity::isImport
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ImportedEntity);
      if (bVar2) {
        ImportedEntity::importSource
                  (&((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    super_ImportedEntity);
        ImportSource::model((ImportSource *)local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
        name_00 = local_78._0_8_;
        ImportedEntity::importReference_abi_cxx11_
                  (&local_98,
                   &((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    super_ImportedEntity);
        ComponentEntity::component(&local_40,(string *)name_00,SUB81(&local_98,0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        name_01 = local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        NamedEntity::name_abi_cxx11_(&local_98,(NamedEntity *)local_78._16_8_);
        Component::variable((Component *)&local_58,(string *)name_01);
        p_Var1 = p_Stack_50;
        local_78._16_8_ = local_58;
        this._M_pi = _Stack_60._M_pi;
        local_58 = (element_type *)0x0;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_60._M_pi = p_Var1;
        if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
        }
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
      }
      Variable::units((Variable *)local_78._16_8_);
      NamedEntity::name_abi_cxx11_(&local_98,(NamedEntity *)local_78._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name->_M_string_length) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar2 = true;
        }
        else {
          iVar3 = bcmp(local_98._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_98._M_string_length)
          ;
          bVar2 = iVar3 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      if (bVar2) {
        Variable::setUnits((Variable *)local_78._16_8_,units);
      }
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      uVar5 = uVar5 + 1;
      sVar4 = Component::variableCount
                        ((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    } while (uVar5 < sVar4);
  }
  sVar4 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar4 != 0) {
    uVar5 = 0;
    do {
      ComponentEntity::component
                ((ComponentEntity *)&local_98,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      updateComponentsVariablesUnitsNames(name,(ComponentPtr *)&local_98,units);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      uVar5 = uVar5 + 1;
      sVar4 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar5 < sVar4);
  }
  return;
}

Assistant:

void updateComponentsVariablesUnitsNames(const std::string &name, const ComponentPtr &component, const UnitsPtr &units)
{
    for (size_t variableIndex = 0; variableIndex < component->variableCount(); ++variableIndex) {
        auto variable = component->variable(variableIndex);
        if (component->isImport()) {
            auto importModel = component->importSource()->model();
            auto importComponent = importModel->component(component->importReference());
            variable = importComponent->variable(variable->name());
        }
        if (variable->units()->name() == name) {
            variable->setUnits(units);
        }
    }
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        updateComponentsVariablesUnitsNames(name, childComponent, units);
    }
}